

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# context.h
# Opt level: O2

void __thiscall
bandit::context::bandit::run_all
          (bandit *this,
          list<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *funcs)

{
  _List_node_base *p_Var1;
  function<void_()> f;
  function<void_()> fStack_38;
  
  p_Var1 = (_List_node_base *)funcs;
  while (p_Var1 = (((_List_base<std::function<void_()>,_std::allocator<std::function<void_()>_>_> *)
                   &p_Var1->_M_next)->_M_impl)._M_node.super__List_node_base._M_next,
        p_Var1 != (_List_node_base *)funcs) {
    std::function<void_()>::function(&fStack_38,(function<void_()> *)(p_Var1 + 1));
    std::function<void_()>::operator()(&fStack_38);
    std::_Function_base::~_Function_base(&fStack_38.super__Function_base);
  }
  return;
}

Assistant:

void run_all(const std::list<std::function<void()>>& funcs) {
        for (auto f : funcs) {
          f();
        }
      }